

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O2

void __thiscall
jsonnet::internal::SortImports::ImportElem::ImportElem
          (ImportElem *this,UString *key,Fodder *adjacentFodder,Bind *bind)

{
  std::__cxx11::u32string::u32string((u32string *)this,key);
  std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
  vector(&this->adjacentFodder,adjacentFodder);
  Local::Bind::Bind(&this->bind,bind);
  return;
}

Assistant:

ImportElem(UString key, Fodder adjacentFodder, Local::Bind bind)
            : key(key), adjacentFodder(adjacentFodder), bind(bind)
        {
        }